

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_format.c
# Opt level: O2

wchar_t archive_read_set_format(archive *_a,wchar_t code)

{
  char *__s1;
  undefined4 uVar1;
  undefined3 uVar2;
  wchar_t wVar3;
  int iVar4;
  wchar_t wVar5;
  long lVar6;
  char str [10];
  
  wVar3 = archive_read_support_format_by_code(_a,code);
  if (wVar3 < L'\0') {
    return wVar3;
  }
  wVar3 = L'\xffffffec';
  if (_a[0x15].archive_format_name == (char *)0x0) {
    wVar3 = L'\0';
  }
  uVar2 = str._5_3_;
  switch((uint)((code & 0xff0000U) - 0x10000U) >> 0x10) {
  case 0:
    str._0_8_ = (ulong)(uint3)uVar2 << 0x28;
    builtin_strncpy(str,"cpio",4);
    break;
  default:
    archive_set_error(_a,0x16,"Invalid format code specified");
    return L'\xffffffe2';
  case 2:
    builtin_strncpy(str,"tar",4);
    break;
  case 3:
    builtin_strncpy(str,"iso9660",8);
    break;
  case 4:
    builtin_strncpy(str,"zip",4);
    break;
  case 6:
    str._2_6_ = SUB86(str._0_8_,2) & 0xffffffffff00;
    str[0] = 'a';
    str[1] = 'r';
    break;
  case 7:
    builtin_strncpy(str,"mtree",6);
    uVar1 = str._0_4_;
    str._0_8_ = CONCAT44(str._4_4_,uVar1);
    break;
  case 9:
    builtin_strncpy(str,"xar",4);
    break;
  case 10:
    builtin_strncpy(str,"lha",4);
    break;
  case 0xb:
    builtin_strncpy(str,"cab",4);
    break;
  case 0xc:
    builtin_strncpy(str,"rar",4);
    break;
  case 0xd:
    str._0_8_ = (ulong)(uint3)uVar2 << 0x28;
    builtin_strncpy(str,"7zip",4);
  }
  lVar6 = 0x3c8;
  while( true ) {
    _a[0x15].archive_format_name = (char *)((long)&_a->magic + lVar6);
    __s1 = *(char **)((long)&_a->vtable + lVar6);
    if ((int)lVar6 == 0x948) break;
    if (__s1 == (char *)0x0) goto LAB_001ec574;
    iVar4 = strcmp(__s1,str);
    if (iVar4 == 0) goto LAB_001ec565;
    lVar6 = lVar6 + 0x58;
  }
  if (__s1 != (char *)0x0) {
LAB_001ec565:
    iVar4 = strcmp(__s1,str);
    if (iVar4 == 0) {
      wVar5 = L'\0';
      goto LAB_001ec58f;
    }
  }
LAB_001ec574:
  archive_set_error(_a,0x16,"Internal error: Unable to set format");
  wVar5 = L'\xffffffe2';
LAB_001ec58f:
  if (wVar5 < wVar3) {
    wVar3 = wVar5;
  }
  return wVar3;
}

Assistant:

int
archive_read_set_format(struct archive *_a, int code)
{
  int r1, r2, slots, i;
  char str[10];
  struct archive_read *a = (struct archive_read *)_a;

  if ((r1 = archive_read_support_format_by_code(_a, code)) < (ARCHIVE_OK))
    return r1;

  r1 = r2 = (ARCHIVE_OK);
  if (a->format)
    r2 = (ARCHIVE_WARN);
  switch (code & ARCHIVE_FORMAT_BASE_MASK)
  {
    case ARCHIVE_FORMAT_7ZIP:
      strcpy(str, "7zip");
      break;
    case ARCHIVE_FORMAT_AR:
      strcpy(str, "ar");
      break;
    case ARCHIVE_FORMAT_CAB:
      strcpy(str, "cab");
      break;
    case ARCHIVE_FORMAT_CPIO:
      strcpy(str, "cpio");
      break;
    case ARCHIVE_FORMAT_ISO9660:
      strcpy(str, "iso9660");
      break;
    case ARCHIVE_FORMAT_LHA:
      strcpy(str, "lha");
      break;
    case ARCHIVE_FORMAT_MTREE:
      strcpy(str, "mtree");
      break;
    case ARCHIVE_FORMAT_RAR:
      strcpy(str, "rar");
      break;
    case ARCHIVE_FORMAT_TAR:
      strcpy(str, "tar");
      break;
    case ARCHIVE_FORMAT_XAR:
      strcpy(str, "xar");
      break;
    case ARCHIVE_FORMAT_ZIP:
      strcpy(str, "zip");
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid format code specified");
      return (ARCHIVE_FATAL);
  }

  slots = sizeof(a->formats) / sizeof(a->formats[0]);
  a->format = &(a->formats[0]);
  for (i = 0; i < slots; i++, a->format++) {
    if (!a->format->name || !strcmp(a->format->name, str))
      break;
  }
  if (!a->format->name || strcmp(a->format->name, str))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
        "Internal error: Unable to set format");
    r1 = (ARCHIVE_FATAL);
  }

  return (r1 < r2) ? r1 : r2;
}